

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O3

int Bac_BoxBoNum(Bac_Ntk_t *p,int i)

{
  uint uVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  
  if (-1 < i) {
    uVar1 = (p->vType).nSize;
    if (i < (int)uVar1) {
      pcVar2 = (p->vType).pArray;
      uVar5 = (ulong)(uint)i;
      if (((byte)pcVar2[uVar5] >> 1) - 0x49 < 0xffffffbc) {
        __assert_fail("Bac_ObjIsBox(p, i)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                      ,0x131,"int Bac_BoxBoNum(Bac_Ntk_t *, int)");
      }
      iVar3 = i + -1;
      do {
        uVar5 = uVar5 + 1;
        iVar4 = uVar1 - 1;
        if (uVar1 <= uVar5) break;
        iVar3 = iVar3 + 1;
        iVar4 = iVar3;
      } while ((pcVar2[uVar5] & 0xfeU) == 8);
      return iVar4 - i;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
}

Assistant:

static inline int            Bac_BoxBoNum( Bac_Ntk_t * p, int i )            { int s = i+1; assert(Bac_ObjIsBox(p, i)); while (++i < Bac_NtkObjNum(p) && Bac_ObjIsBo(p, i)) {} return i - s;  }